

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O0

cmJSONHelper<bool> *
cmJSONHelperBuilder::Bool(cmJSONHelper<bool> *__return_storage_ptr__,bool defval)

{
  ErrorGenerator local_38;
  byte local_11;
  cmJSONHelper<bool> *pcStack_10;
  bool defval_local;
  
  local_11 = defval;
  pcStack_10 = __return_storage_ptr__;
  std::function<void(Json::Value_const*,cmJSONState*)>::
  function<void(&)(Json::Value_const*,cmJSONState*),void>
            ((function<void(Json::Value_const*,cmJSONState*)> *)&local_38,JsonErrors::INVALID_BOOL);
  Bool(__return_storage_ptr__,&local_38,(bool)(local_11 & 1));
  std::function<void_(const_Json::Value_*,_cmJSONState_*)>::~function(&local_38);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<bool> Bool(bool defval)
  {
    return Bool(JsonErrors::INVALID_BOOL, defval);
  }